

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  char ichar;
  streamsize sVar1;
  streamsize local_2e0;
  output_adapter<char> local_2c8;
  output_adapter_t<char> local_2b8;
  undefined1 local_2a8 [8];
  serializer s;
  streamsize indentation;
  bool pretty_print;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *j_local;
  ostream *o_local;
  
  sVar1 = Catch::clara::std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)));
  if (0 < sVar1) {
    local_2e0 = Catch::clara::std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)));
  }
  else {
    local_2e0 = 0;
  }
  s.indent_string.field_2._8_8_ = local_2e0;
  Catch::clara::std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)),0);
  detail::output_adapter<char>::output_adapter(&local_2c8,o);
  detail::output_adapter::operator_cast_to_shared_ptr((output_adapter *)&local_2b8);
  ichar = std::ios::fill();
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::serializer((serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *)local_2a8,&local_2b8,ichar);
  Catch::clara::std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>_>::~shared_ptr
            (&local_2b8);
  detail::output_adapter<char>::~output_adapter(&local_2c8);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::dump((serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          *)local_2a8,j,0 < sVar1,false,s.indent_string.field_2._8_4_,0);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~serializer((serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)local_2a8);
  return o;
}

Assistant:

friend std::ostream& operator<<(std::ostream& o, const basic_json& j)
{
// read width member and use it as indentation parameter if nonzero
const bool pretty_print = (o.width() > 0);
const auto indentation = (pretty_print ? o.width() : 0);

// reset width to 0 for subsequent calls to this stream
o.width(0);

// do the actual serialization
serializer s(detail::output_adapter<char>(o), o.fill());
s.dump(j, pretty_print, false, static_cast<unsigned int>(indentation));
return o;
}